

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O2

undefined1  [16] __thiscall
cfd::api::ElementsTransactionApi::EstimateFee
          (ElementsTransactionApi *this,string *tx_hex,
          vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *utxos,ConfidentialAssetId *fee_asset,Amount *txout_fee,Amount *utxo_fee,bool is_blind,
          uint64_t effective_fee_rate,int exponent,int minimum_bits,uint32_t *append_asset_count)

{
  pointer pEVar1;
  Script SVar2;
  Script SVar3;
  Script SVar4;
  Script SVar5;
  long lVar6;
  uint32_t *puVar7;
  AddressType AVar8;
  char cVar9;
  bool bVar10;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  int iVar14;
  uint32_t uVar15;
  undefined8 uVar16;
  CfdException *pCVar17;
  undefined1 extraout_DL;
  Amount extraout_DL_00;
  Amount extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined8 extraout_RDX;
  NetType type;
  Script *pSVar18;
  ulong uVar19;
  pointer pEVar20;
  uint32_t uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined7 uStack_7e8;
  byte local_7e1;
  undefined1 auStack_7e0 [12];
  uint32_t txin_size;
  uint local_7d0;
  uint32_t wit_size;
  uint local_7c8;
  AddressType local_7c4;
  FeeCalculator fee_calc;
  uint32_t local_7bc;
  undefined1 uVar24;
  uint7 uStack_7b7;
  Script *pSVar25;
  uint32_t tx_size;
  undefined4 uStack_7a4;
  int in_stack_fffffffffffff860;
  undefined4 uStack_79c;
  pointer in_stack_fffffffffffff868;
  uint in_stack_fffffffffffff870;
  uint32_t rangeproof_size_cache;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *local_788;
  ulong local_780;
  undefined8 local_778;
  undefined1 local_770;
  Script redeem_script;
  uint32_t tx_witness_size;
  Script claim_script;
  Script local_6c0;
  ElementsAddressFactory factory;
  ConfidentialTxInReference ref;
  Script local_500;
  Script local_4c8;
  ConfidentialTransactionContext txc;
  Script local_3d8;
  DescriptorScriptData data;
  Script local_68;
  
  local_788 = utxos;
  ConfidentialTransactionContext::ConfidentialTransactionContext(&txc,tx_hex);
  cVar9 = cfd::core::ConfidentialAssetId::IsEmpty();
  if (cVar9 != '\0') {
    data._0_8_ = (long)
                 "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfdapi_elements_transaction.cpp"
                 + 99;
    data.locking_script._vptr_Script._0_4_ = 0x228;
    data.locking_script.script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "EstimateFee";
    core::logger::warn<>((CfdSourceLocation *)&data,"Failed to EstimateFee. Empty fee asset.");
    pCVar17 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&data,"Empty fee asset.",(allocator *)&ref);
    core::CfdException::CfdException(pCVar17,kCfdIllegalArgumentError,(string *)&data);
    __cxa_throw(pCVar17,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cfd::core::ConfidentialTransaction::GetTxOutList();
  for (; redeem_script._vptr_Script !=
         (_func_int **)
         redeem_script.script_data_.data_.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
      redeem_script._vptr_Script = redeem_script._vptr_Script + 0x1f) {
    cfd::core::Script::Script((Script *)&data,(Script *)(redeem_script._vptr_Script + 3));
    cVar9 = cfd::core::Script::IsEmpty();
    core::Script::~Script((Script *)&data);
    if (cVar9 != '\0') {
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)&data,
                 (ConfidentialAssetId *)(redeem_script._vptr_Script + 10));
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      bVar10 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ref,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&claim_script);
      std::__cxx11::string::~string((string *)&claim_script);
      std::__cxx11::string::~string((string *)&ref);
      core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&data);
      if (bVar10) {
        data._0_8_ = (long)
                     "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfdapi_elements_transaction.cpp"
                     + 99;
        data.locking_script._vptr_Script._0_4_ = 0x231;
        data.locking_script.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "EstimateFee";
        core::logger::warn<>((CfdSourceLocation *)&data,"Failed to EstimateFee. Unmatch fee asset.")
        ;
        pCVar17 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&data,"Unmatch fee asset.",(allocator *)&ref);
        core::CfdException::CfdException(pCVar17,kCfdIllegalArgumentError,(string *)&data);
        __cxa_throw(pCVar17,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      std::
      vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                 *)&redeem_script);
      goto LAB_00236e2f;
    }
  }
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             *)&redeem_script);
  data._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(1);
  data.locking_script._vptr_Script._0_1_ = extraout_DL;
  cfd::core::ConfidentialTransaction::AddTxOutFee((Amount *)&txc,(ConfidentialAssetId *)&data);
LAB_00236e2f:
  wit_size = 0;
  txin_size = 0;
  rangeproof_size_cache = 0;
  pEVar20 = (local_788->
            super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (local_788->
           super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar24 = 0;
  uStack_7b7 = 0;
  uVar21 = 0;
  pSVar25 = (Script *)0x0;
  local_7c8 = 0;
  do {
    puVar7 = append_asset_count;
    if (pEVar20 == pEVar1) {
      uVar22 = (uint)pSVar25;
      uVar13 = (uint)CONCAT71(uStack_7b7,uVar24);
      if ((uVar22 != 0 && uVar13 != 0) &&
         (uVar13 < (uint)(((long)(local_788->
                                 super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_788->
                                super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                                )._M_impl.super__Vector_impl_data._M_start) / 0x538))) {
        uVar22 = uVar22 + uVar13 * 4;
      }
      uVar15 = cfd::core::AbstractTransaction::GetVsizeFromSize(local_7c8,uVar22);
      tx_witness_size = 0;
      tx_size = 0;
      if ((puVar7 != (uint32_t *)0x0) && (uVar21 = uVar21 + *puVar7, 0xfe < uVar21)) {
        uVar21 = 0xff;
      }
      ConfidentialTransactionContext::GetSizeIgnoreTxIn
                (&txc,is_blind,&tx_witness_size,&tx_size,exponent,minimum_bits,uVar21);
      uVar21 = cfd::core::AbstractTransaction::GetVsizeFromSize(tx_size,tx_witness_size);
      FeeCalculator::FeeCalculator(&fee_calc,effective_fee_rate);
      ref.super_AbstractTxInReference._vptr_AbstractTxInReference =
           (_func_int **)FeeCalculator::GetFee(&fee_calc,uVar21);
      ref.super_AbstractTxInReference.txid_._vptr_Txid._0_1_ = extraout_DL_00;
      claim_script._vptr_Script = (_func_int **)FeeCalculator::GetFee(&fee_calc,uVar15);
      claim_script.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = extraout_DL_01;
      uVar21 = cfd::core::AbstractTransaction::GetVsizeFromSize
                         (local_7c8 + tx_size,uVar22 + tx_witness_size);
      local_778 = FeeCalculator::GetFee(&fee_calc,uVar21);
      if (txout_fee != (Amount *)0x0) {
        txout_fee[8] = ref.super_AbstractTxInReference.txid_._vptr_Txid._0_1_;
        *(_func_int ***)txout_fee = ref.super_AbstractTxInReference._vptr_AbstractTxInReference;
      }
      if (utxo_fee != (Amount *)0x0) {
        utxo_fee[8] = claim_script.script_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start._0_1_;
        *(_func_int ***)utxo_fee = claim_script._vptr_Script;
      }
      data._0_8_ = (long)
                   "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfdapi_elements_transaction.cpp"
                   + 99;
      data.locking_script._vptr_Script._0_4_ = 0x2cd;
      data.locking_script.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "EstimateFee";
      local_770 = extraout_DL_02;
      redeem_script._vptr_Script = (_func_int **)cfd::core::Amount::GetSatoshiValue();
      local_6c0._vptr_Script = (_func_int **)cfd::core::Amount::GetSatoshiValue();
      factory.super_AddressFactory._vptr_AddressFactory =
           (_func_int **)cfd::core::Amount::GetSatoshiValue();
      core::logger::info<unsigned_long&,long,long,long>
                ((CfdSourceLocation *)&data,"EstimateFee rate={} fee={} tx={} utxo={}",
                 &effective_fee_rate,(long *)&redeem_script,(long *)&local_6c0,(long *)&factory);
      ConfidentialTransactionContext::~ConfidentialTransactionContext(&txc);
      auVar23._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
      auVar23[8] = local_770;
      auVar23._0_8_ = local_778;
      return auVar23;
    }
    cfd::core::Address::GetAddress_abi_cxx11_();
    lVar6 = CONCAT44(data.locking_script._vptr_Script._4_4_,data.locking_script._vptr_Script._0_4_);
    std::__cxx11::string::~string((string *)&data);
    type = kLiquidV1;
    if (lVar6 != 0) {
      type = *(NetType *)&(pEVar20->utxo).address;
    }
    ElementsAddressFactory::ElementsAddressFactory(&factory,type);
    txin_size = 0;
    wit_size = 0;
    cfd::core::Script::Script(&claim_script);
    local_7bc = 0;
    uVar19 = 0;
    if (pEVar20->is_pegin == true) {
      local_7bc = pEVar20->pegin_btc_tx_size;
      uVar19 = (ulong)pEVar20->pegin_txoutproof_size;
      cfd::core::Script::operator=(&claim_script,&pEVar20->claim_script);
    }
    std::__cxx11::string::string((string *)&tx_witness_size,(string *)&(pEVar20->utxo).descriptor);
    std::__cxx11::string::string((string *)&ref,"",(allocator *)&redeem_script);
    AddressFactory::ParseOutputDescriptor
              (&data,&factory.super_AddressFactory,(string *)&tx_witness_size,(string *)&ref,
               (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0,
               (vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x0,
               (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0);
    local_780 = uVar19;
    std::__cxx11::string::~string((string *)&ref);
    cfd::core::Address::GetAddress_abi_cxx11_();
    AVar8 = data.address_type;
    if (data.address_type == kP2shP2wpkhAddress ||
        CONCAT71(ref.super_AbstractTxInReference.txid_._vptr_Txid._1_7_,
                 ref.super_AbstractTxInReference.txid_._vptr_Txid._0_1_) == 0) {
      std::__cxx11::string::~string((string *)&ref);
      local_7c4 = data.address_type;
    }
    else {
      std::__cxx11::string::~string((string *)&ref);
      local_7c4 = data.address_type;
      if (AVar8 != kP2shP2wshAddress) {
        local_7c4 = *(AddressType *)&(pEVar20->utxo).field_0xc4;
      }
    }
    cfd::core::Script::Script(&redeem_script);
    pSVar18 = &(pEVar20->utxo).redeem_script;
    cVar9 = cfd::core::Script::IsEmpty();
    if (cVar9 != '\0') {
      cVar9 = cfd::core::Script::IsEmpty();
      if (cVar9 == '\0') {
        pSVar18 = &data.redeem_script;
      }
    }
    cfd::core::Script::operator=(&redeem_script,pSVar18);
    uVar16 = cfd::core::Script::IsEmpty();
    if ((char)uVar16 == '\0') {
      pSVar18 = &(pEVar20->utxo).scriptsig_template;
      cVar9 = cfd::core::Script::IsEmpty();
      uVar16 = 0;
      if (cVar9 != '\0') {
        pSVar18 = (Script *)0x0;
      }
    }
    else {
      pSVar18 = (Script *)0x0;
    }
    local_7e1 = pEVar20->is_issuance;
    local_7d0 = (uint)CONCAT71((int7)((ulong)uVar16 >> 8),pEVar20->is_blind_issuance);
    cfd::core::OutPoint::OutPoint((OutPoint *)&local_6c0,&(pEVar20->utxo).txid,(pEVar20->utxo).vout)
    ;
    ConfidentialTransactionContext::GetTxIn(&ref,&txc,(OutPoint *)&local_6c0);
    core::Txid::~Txid((Txid *)&local_6c0);
    if (pEVar20->is_issuance == true) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_6c0,
                 &ref.asset_entropy_.data_);
      cVar9 = cfd::core::ByteData256::IsEmpty();
      if (cVar9 == '\0') {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_size,
                   &ref.blinding_nonce_.data_);
        bVar11 = cfd::core::ByteData256::IsEmpty();
        bVar11 = bVar11 ^ 1;
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx_size);
      }
      else {
        bVar11 = 0;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_6c0);
    }
    else {
      if (pEVar20->is_blind_issuance == false) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_6c0,
                   &ref.asset_entropy_.data_);
        cVar9 = cfd::core::ByteData256::IsEmpty();
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_6c0);
        if (cVar9 == '\0') {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_6c0,
                     &ref.blinding_nonce_.data_);
          bVar12 = cfd::core::ByteData256::IsEmpty();
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_6c0);
          bVar11 = bVar12 ^ 1;
          local_7d0 = (uint)is_blind;
          if (bVar12 == 0) {
            local_7d0 = 1;
          }
          local_7e1 = 1;
          goto LAB_00237152;
        }
      }
      bVar11 = 0;
    }
LAB_00237152:
    uVar13 = cfd::core::ScriptWitness::GetWitnessNum();
    if (5 < uVar13) {
      core::ScriptWitness::ScriptWitness((ScriptWitness *)&local_6c0,&ref.pegin_witness_);
      cfd::core::ScriptWitness::GetWitness();
      core::ScriptWitness::~ScriptWitness((ScriptWitness *)&local_6c0);
      local_7bc = cfd::core::ByteData::GetDataSize();
      local_780 = cfd::core::ByteData::GetDataSize();
      cfd::core::Script::Script(&local_6c0,(ByteData *)(CONCAT44(uStack_7a4,tx_size) + 0x48));
      cfd::core::Script::operator=(&claim_script,&local_6c0);
      core::Script::~Script(&local_6c0);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&tx_size);
    }
    if (pEVar20->is_issuance == true) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_6c0,
                 &ref.asset_entropy_.data_);
      cVar9 = cfd::core::ByteData256::IsEmpty();
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_6c0);
      if (cVar9 == '\0') goto LAB_00237233;
    }
    else {
LAB_00237233:
      if ((pEVar20->is_pegin != true) ||
         (uVar13 = cfd::core::ScriptWitness::GetWitnessNum(), 5 < uVar13)) {
        cfd::core::Script::Script(&local_4c8,&redeem_script);
        cfd::core::Script::Script(&local_68,&claim_script);
        SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)pSVar18;
        SVar3._vptr_Script = (_func_int **)&local_68;
        SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = (int)&wit_size;
        SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = (int)((ulong)&wit_size >> 0x20);
        SVar3.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&txin_size;
        SVar3.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start._0_7_ = uStack_7e8;
        SVar3.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start._7_1_ = local_7e1;
        SVar3.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._8_12_ = auStack_7e0;
        SVar3.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = txin_size;
        SVar5._vptr_Script._4_4_ = wit_size;
        SVar5._vptr_Script._0_4_ = local_7d0;
        SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = local_7c8;
        SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ = local_7c4;
        SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = fee_calc.baserate_;
        SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = local_7bc;
        SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = uVar24;
        SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = uStack_7b7;
        SVar5.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)pSVar25;
        SVar5.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = tx_size;
        SVar5.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = uStack_7a4;
        SVar5.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffff860;
        SVar5.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = uStack_79c;
        cfd::core::ConfidentialTxInReference::EstimateTxInSize
                  ((AddressType)&ref,SVar3,SUB41(local_7c4,0),(int)&local_4c8,local_7d0 & 0xff,SVar5
                   ,(Script *)(ulong)(uint)exponent,(uint *)(ulong)(uint)minimum_bits,
                   (uint *)in_stack_fffffffffffff868);
        core::Script::~Script(&local_68);
        core::Script::~Script(&local_4c8);
      }
    }
    core::ConfidentialTxInReference::~ConfidentialTxInReference(&ref);
    uVar15 = uVar21 + 2;
    if (local_7e1 == 0) {
      uVar15 = uVar21;
    }
    if (bVar11 != 0) {
      uVar15 = uVar21 + 1;
    }
    if (txin_size == 0) {
      cfd::core::Script::Script(&local_500,&redeem_script);
      cfd::core::Script::Script(&local_3d8,&claim_script);
      SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&txin_size;
      SVar2._vptr_Script = (_func_int **)&wit_size;
      SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_1_ = bVar11;
      SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pSVar18;
      SVar2.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = exponent;
      SVar2.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
      SVar2.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = minimum_bits;
      SVar2.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      SVar2.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)&rangeproof_size_cache;
      SVar2.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           (int)((ulong)&rangeproof_size_cache >> 0x20);
      SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start._0_7_ = uStack_7e8;
      SVar4._vptr_Script = (_func_int **)local_780;
      SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start._7_1_ = local_7e1;
      SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._8_12_ = auStack_7e0;
      SVar4.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = txin_size;
      SVar4.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = local_7d0;
      SVar4.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start._4_4_ = wit_size;
      SVar4.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = local_7c8;
      SVar4.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = local_7c4;
      SVar4.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = fee_calc.baserate_;
      SVar4.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_7bc;
      cfd::core::ConfidentialTxIn::EstimateTxInSize
                (local_7c4,SVar2,(uint)&local_500,SVar4,SUB41(local_7bc,0),SUB81(&local_3d8,0),
                 (uint *)(ulong)local_7e1,(uint *)(ulong)(byte)local_7d0,(bool)uVar24,pSVar25,
                 tx_size,in_stack_fffffffffffff860,(uint *)in_stack_fffffffffffff868,
                 in_stack_fffffffffffff870);
      core::Script::~Script(&local_3d8);
      core::Script::~Script(&local_500);
    }
    uVar21 = uVar15 + 1;
    local_7c8 = local_7c8 + txin_size;
    pSVar25 = (Script *)(ulong)((int)pSVar25 + wit_size);
    iVar14 = (int)CONCAT71(uStack_7b7,uVar24) + (uint)(wit_size == 0);
    uVar24 = (undefined1)iVar14;
    uStack_7b7 = (uint7)(uint3)((uint)iVar14 >> 8);
    core::Script::~Script(&redeem_script);
    DescriptorScriptData::~DescriptorScriptData(&data);
    std::__cxx11::string::~string((string *)&tx_witness_size);
    core::Script::~Script(&claim_script);
    AddressFactory::~AddressFactory(&factory.super_AddressFactory);
    pEVar20 = pEVar20 + 1;
  } while( true );
}

Assistant:

Amount ElementsTransactionApi::EstimateFee(
    const std::string& tx_hex, const std::vector<ElementsUtxoAndOption>& utxos,
    const ConfidentialAssetId& fee_asset, Amount* txout_fee, Amount* utxo_fee,
    bool is_blind, uint64_t effective_fee_rate, int exponent, int minimum_bits,
    uint32_t* append_asset_count) const {
  ConfidentialTransactionContext txc(tx_hex);

  if (fee_asset.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "Failed to EstimateFee. Empty fee asset.");
    throw CfdException(CfdError::kCfdIllegalArgumentError, "Empty fee asset.");
  }

  // check fee in txout
  bool exist_fee = false;
  for (const auto& txout : txc.GetTxOutList()) {
    if (txout.GetLockingScript().IsEmpty()) {
      if (txout.GetAsset().GetHex() != fee_asset.GetHex()) {
        warn(CFD_LOG_SOURCE, "Failed to EstimateFee. Unmatch fee asset.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Unmatch fee asset.");
      }
      exist_fee = true;
      break;
    }
  }
  if (!exist_fee) {
    txc.AddTxOutFee(Amount::CreateBySatoshiAmount(1), fee_asset);  // dummy fee
  }

  uint32_t size = 0;
  uint32_t witness_size = 0;
  uint32_t wit_size = 0;
  uint32_t txin_size = 0;
  uint32_t rangeproof_size_cache = 0;
  uint32_t asset_count = 0;
  uint32_t not_witness_count = 0;
  for (const auto& utxo : utxos) {
    NetType net_type = NetType::kLiquidV1;
    if (!utxo.utxo.address.GetAddress().empty()) {
      net_type = utxo.utxo.address.GetNetType();
    }
    ElementsAddressFactory factory(net_type);

    uint32_t pegin_btc_tx_size = 0;
    uint32_t pegin_txoutproof_size = 0;
    txin_size = 0;
    wit_size = 0;
    Script claim_script;
    if (utxo.is_pegin) {
      pegin_btc_tx_size = utxo.pegin_btc_tx_size;
      pegin_txoutproof_size = utxo.pegin_txoutproof_size;
      claim_script = utxo.claim_script;
    }
    // check descriptor
    std::string descriptor = utxo.utxo.descriptor;
    // set dummy NetType for getting AddressType.
    auto data = factory.ParseOutputDescriptor(descriptor, "");

    AddressType addr_type;
    if (utxo.utxo.address.GetAddress().empty() ||
        data.address_type == AddressType::kP2shP2wpkhAddress ||
        data.address_type == AddressType::kP2shP2wshAddress) {
      addr_type = data.address_type;
    } else {
      addr_type = utxo.utxo.address.GetAddressType();
    }

    Script redeem_script;
    if (utxo.utxo.redeem_script.IsEmpty() && !data.redeem_script.IsEmpty()) {
      redeem_script = data.redeem_script;
    } else {
      redeem_script = utxo.utxo.redeem_script;
    }
    const Script* scriptsig_template = nullptr;
    if ((!redeem_script.IsEmpty()) &&
        (!utxo.utxo.scriptsig_template.IsEmpty())) {
      scriptsig_template = &utxo.utxo.scriptsig_template;
    }
    bool is_issuance = utxo.is_issuance;
    bool is_reissuance = false;
    bool is_blind_issuance = utxo.is_blind_issuance;
    try {
      auto ref = txc.GetTxIn(OutPoint(utxo.utxo.txid, utxo.utxo.vout));
      if (utxo.is_issuance) {
        if ((!ref.GetAssetEntropy().IsEmpty()) &&
            (!ref.GetBlindingNonce().IsEmpty())) {
          is_reissuance = true;
        }
      } else if ((!utxo.is_issuance) && (!utxo.is_blind_issuance)) {  // init
        if (!ref.GetAssetEntropy().IsEmpty()) {
          is_issuance = true;
          is_blind_issuance = is_blind;
          if (!ref.GetBlindingNonce().IsEmpty()) {
            is_reissuance = true;
            is_blind_issuance = true;
          }
        }
      }
      if (ref.GetPeginWitnessStackNum() >= 6) {
        std::vector<ByteData> pegin_stack = ref.GetPeginWitness().GetWitness();
        pegin_btc_tx_size =
            static_cast<uint32_t>(pegin_stack[4].GetDataSize());
        pegin_txoutproof_size =
            static_cast<uint32_t>(pegin_stack[5].GetDataSize());
        claim_script = Script(pegin_stack[3]);
      }

      if (utxo.is_issuance && ref.GetAssetEntropy().IsEmpty()) {
        // unmatch pattern. (using input utxo data)
      } else if (utxo.is_pegin && (ref.GetPeginWitnessStackNum() < 6)) {
        // unmatch pattern. (using input utxo data)
      } else {
        ref.EstimateTxInSize(
            addr_type, redeem_script, is_blind_issuance, exponent,
            minimum_bits, claim_script, scriptsig_template, &wit_size,
            &txin_size);
      }
    } catch (const CfdException& except) {
      info(CFD_LOG_SOURCE, "Error:{}", std::string(except.what()));
    }

    if (is_reissuance)
      ++asset_count;
    else if (is_issuance)
      asset_count += 2;

    ++asset_count;
    if (txin_size == 0) {
      ConfidentialTxIn::EstimateTxInSize(
          addr_type, redeem_script, pegin_btc_tx_size, claim_script,
          is_issuance, is_blind_issuance, &wit_size, &txin_size, is_reissuance,
          scriptsig_template, exponent, minimum_bits, &rangeproof_size_cache,
          pegin_txoutproof_size);
    }
    size += txin_size;
    witness_size += wit_size;
    if (wit_size == 0) ++not_witness_count;
  }
  if ((witness_size != 0) && (not_witness_count != 0) &&
      (not_witness_count < static_cast<uint32_t>(utxos.size()))) {
    // append witness size for p2pkh or p2sh
    witness_size += not_witness_count * 4;
  }

  uint32_t utxo_vsize =
      AbstractTransaction::GetVsizeFromSize(size, witness_size);

  uint32_t tx_witness_size = 0;
  uint32_t tx_size = 0;
  if (append_asset_count != nullptr) {
    if ((asset_count + *append_asset_count) < 255) {
      asset_count += *append_asset_count;
    } else {
      asset_count = 255;
    }
  }
  txc.GetSizeIgnoreTxIn(
      is_blind, &tx_witness_size, &tx_size, exponent, minimum_bits,
      asset_count);
  uint32_t tx_vsize =
      AbstractTransaction::GetVsizeFromSize(tx_size, tx_witness_size);

  FeeCalculator fee_calc(effective_fee_rate);
  Amount tx_fee_amount = fee_calc.GetFee(tx_vsize);
  Amount utxo_fee_amount = fee_calc.GetFee(utxo_vsize);
  uint32_t total_vsize = AbstractTransaction::GetVsizeFromSize(
      tx_size + size, tx_witness_size + witness_size);
  Amount fee = fee_calc.GetFee(total_vsize);

  if (txout_fee) *txout_fee = tx_fee_amount;
  if (utxo_fee) *utxo_fee = utxo_fee_amount;

  info(
      CFD_LOG_SOURCE, "EstimateFee rate={} fee={} tx={} utxo={}",
      effective_fee_rate, fee.GetSatoshiValue(),
      tx_fee_amount.GetSatoshiValue(), utxo_fee_amount.GetSatoshiValue());
  return fee;
}